

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_DataBlock(VGMPlayer *this)

{
  byte bVar1;
  UINT8 UVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  CHIP_DEVICE *pCVar6;
  uint uVar7;
  uint *puVar8;
  long lVar9;
  long lVar10;
  byte chipID;
  PCM_BANK *this_00;
  uint inLen;
  ulong uVar11;
  UINT8 *pUVar12;
  UINT32 oldLen;
  uint local_5c;
  UINT32 local_58;
  UINT32 local_54;
  PCM_CDB_INF dbCI;
  
  pUVar12 = this->_fileData;
  uVar5 = this->_filePos;
  bVar1 = pUVar12[(ulong)uVar5 + 2];
  uVar7 = (uint)bVar1;
  uVar3 = *(uint *)(pUVar12 + (ulong)uVar5 + 3);
  inLen = uVar3 & 0x7fffffff;
  uVar5 = uVar5 + 7;
  this->_filePos = uVar5;
  if (bVar1 >> 6 < 2) {
    if (uVar7 == 0x7f) {
      ReadPCMComprTable(inLen,pUVar12 + uVar5,&this->_pcmComprTbl);
    }
    else {
      uVar7 = uVar7 & 0x3f;
      this_00 = this->_pcmBank + uVar7;
      oldLen = *(int *)&this->_pcmBank[uVar7].data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
               *(int *)&(this_00->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
      pUVar12 = pUVar12 + uVar5;
      local_5c = inLen;
      if ((bVar1 & 0x40) == 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->_pcmBank[uVar7].bankOfs,&oldLen);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->_pcmBank[uVar7].bankSize,&local_5c);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this_00->data,(ulong)(local_5c + oldLen));
        memcpy((this_00->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + oldLen,pUVar12,(ulong)local_5c);
      }
      else {
        ReadComprDataBlkHdr(inLen,pUVar12,&dbCI);
        dbCI.cmprInfo.comprTbl = &this->_pcmComprTbl;
        local_5c = dbCI.decmpLen;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->_pcmBank[uVar7].bankOfs,&oldLen);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->_pcmBank[uVar7].bankSize,&local_5c);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this_00->data,(ulong)(local_5c + oldLen));
        DecompressDataBlk(local_5c,(this_00->data).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + oldLen,
                          inLen - dbCI.hdrSize,pUVar12 + dbCI.hdrSize,&dbCI.cmprInfo);
      }
    }
    goto LAB_00125d1e;
  }
  chipID = (byte)(uVar3 >> 0x1f);
  if (bVar1 >> 6 == 2) {
    uVar7 = uVar7 & 0x3f;
    UVar2 = _VGM_ROM_CHIPS[uVar7][0];
    pCVar6 = GetDevicePtr(this,UVar2,chipID);
    if (pCVar6 != (CHIP_DEVICE *)0x0) {
      pUVar12 = this->_fileData;
      uVar11 = (ulong)this->_filePos;
      local_58 = *(UINT32 *)(pUVar12 + uVar11);
      local_54 = *(UINT32 *)(pUVar12 + uVar11 + 4);
      uVar5 = inLen - 8;
      if (((UVar2 == '\x1c') && (uVar5 != 0)) && ((pCVar6->flags & 1) != 0)) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dbCI,(ulong)uVar5,
                   (allocator_type *)&oldLen);
        for (lVar9 = 0; (uint)lVar9 < uVar5; lVar9 = lVar9 + 2) {
          *(UINT8 *)(CONCAT44(dbCI.decmpLen,dbCI.hdrSize) + lVar9) = pUVar12[lVar9 + uVar11 + 9];
          *(UINT8 *)(CONCAT44(dbCI.decmpLen,dbCI.hdrSize) + 1 + lVar9) = pUVar12[lVar9 + uVar11 + 8]
          ;
        }
        WriteChipROM(pCVar6,_VGM_ROM_CHIPS[uVar7][1],local_58,local_54,uVar5,
                     (UINT8 *)CONCAT44(dbCI.decmpLen,dbCI.hdrSize));
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dbCI);
      }
      else {
        WriteChipROM(pCVar6,_VGM_ROM_CHIPS[uVar7][1],local_58,local_54,uVar5,pUVar12 + uVar11 + 8);
      }
    }
    goto LAB_00125d1e;
  }
  UVar2 = _VGM_RAM_CHIPS[bVar1 & 0x3f];
  pCVar6 = GetDevicePtr(this,UVar2,chipID);
  if ((pCVar6 == (CHIP_DEVICE *)0x0) || (pCVar6->romWrite == (DEVFUNC_WRITE_BLOCK)0x0))
  goto LAB_00125d1e;
  puVar8 = (uint *)(this->_fileData + this->_filePos);
  if ((bVar1 & 0x20) == 0) {
    uVar5 = (uint)(ushort)*puVar8;
    lVar9 = 2;
    iVar4 = -2;
  }
  else {
    uVar5 = *puVar8;
    lVar9 = 4;
    iVar4 = -4;
  }
  if (UVar2 == '\x05') {
    lVar10 = 0x355c;
LAB_00125d0b:
    uVar5 = uVar5 | (uint)*(byte *)((long)&(this->super_PlayerBase)._vptr_PlayerBase +
                                   (ulong)(uVar3 >> 0x1f) + lVar10) << 0xc;
  }
  else if (UVar2 == '\x10') {
    lVar10 = 0x355e;
    goto LAB_00125d0b;
  }
  (*pCVar6->romWrite)((pCVar6->base).defInf.dataPtr,uVar5,iVar4 + inLen,
                      (UINT8 *)((long)puVar8 + lVar9));
LAB_00125d1e:
  this->_filePos = this->_filePos + inLen;
  return;
}

Assistant:

void VGMPlayer::Cmd_DataBlock(void)
{
	UINT8 dblkType;
	UINT8 chipType;
	UINT8 chipID;
	UINT32 dblkLen;
	UINT32 memSize;
	UINT32 dataOfs;
	UINT32 dataLen;
	const UINT8* dataPtr;
	CHIP_DEVICE* cDev;
	
	dblkType = fData[0x02];
	dblkLen = ReadLE32(&fData[0x03]);
	chipID = (dblkLen & 0x80000000) >> 31;
	dblkLen &= 0x7FFFFFFF;
	_filePos += 0x07;
	
	switch(dblkType & 0xC0)
	{
	case 0x00:	// uncompressed data block
	case 0x40:	// compressed data block
		if (dblkType == 0x7F)
		{
			ReadPCMComprTable(dblkLen, &fData[0x00], &_pcmComprTbl);
		}
		else
		{
			PCM_BANK* pcmBnk = &_pcmBank[dblkType & 0x3F];
			PCM_CDB_INF dbCI;
			UINT32 oldLen = (UINT32)pcmBnk->data.size();
			dataLen = dblkLen;
			dataPtr = &fData[0x00];
			
			if (dblkType & 0x40)
			{
				ReadComprDataBlkHdr(dblkLen, dataPtr, &dbCI);
				dbCI.cmprInfo.comprTbl = &_pcmComprTbl;
				dataLen = dbCI.decmpLen;
			}
			
			pcmBnk->bankOfs.push_back(oldLen);
			pcmBnk->bankSize.push_back(dataLen);
			
			pcmBnk->data.resize(oldLen + dataLen);
			if (dblkType & 0x40)
			{
				DecompressDataBlk(dataLen, &pcmBnk->data[oldLen],
									dblkLen - dbCI.hdrSize, &dataPtr[dbCI.hdrSize], &dbCI.cmprInfo);
			}
			else
			{
				memcpy(&pcmBnk->data[oldLen], dataPtr, dataLen);
			}
			
			// TODO: refresh DAC Stream pointers
		}
		break;
	case 0x80:	// ROM/RAM write
		chipType = _VGM_ROM_CHIPS[dblkType & 0x3F][0];
		cDev = GetDevicePtr(chipType, chipID);
		if (cDev == NULL)
			break;
		
		memSize = ReadLE32(&fData[0x00]);
		dataOfs = ReadLE32(&fData[0x04]);
		dataPtr = &fData[0x08];
		dataLen = dblkLen - 0x08;
		if (chipType == 0x1C && dataLen && (cDev->flags & 0x01))
		{
			// chip == ASIC 219 (ID 0x1C + flags 0x01): byte-swap sample data
			std::vector<UINT8> swpData(dataLen);
			for (UINT32 curPos = 0x00; curPos < dataLen; curPos += 0x02)
			{
				swpData[curPos + 0x00] = dataPtr[curPos + 0x01];
				swpData[curPos + 0x01] = dataPtr[curPos + 0x00];
			}
			WriteChipROM(cDev, _VGM_ROM_CHIPS[dblkType & 0x3F][1], memSize, dataOfs, dataLen, &swpData[0x00]);
		}
		else
		{
			WriteChipROM(cDev, _VGM_ROM_CHIPS[dblkType & 0x3F][1], memSize, dataOfs, dataLen, dataPtr);
		}
		break;
	case 0xC0:	// RAM Write
		chipType = _VGM_RAM_CHIPS[dblkType & 0x3F];
		cDev = GetDevicePtr(chipType, chipID);
		if (cDev == NULL || cDev->romWrite == NULL)
			break;
		
		if (! (dblkType & 0x20))
		{
			// C0..DF: 16-bit addressing
			dataOfs = ReadLE16(&fData[0x00]);
			dataLen = dblkLen - 0x02;
			dataPtr = &fData[0x02];
		}
		else
		{
			// E0..FF: 32-bit addressing
			dataOfs = ReadLE32(&fData[0x00]);
			dataLen = dblkLen - 0x04;
			dataPtr = &fData[0x04];
		}
		DoRAMOfsPatches(chipType, chipID, dataOfs, dataLen);
		cDev->romWrite(cDev->base.defInf.dataPtr, dataOfs, dataLen, dataPtr);
		break;
	}
	
	_filePos += dblkLen;
	return;
}